

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void variance8_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                   __m128i *sum)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  int iVar17;
  int iVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  longlong lVar35;
  int iVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  *sum = (__m128i)0x0;
  *sse = (__m128i)0x0;
  iVar36 = 0;
  if (0 < h) {
    iVar36 = h;
  }
  while (bVar37 = iVar36 != 0, iVar36 = iVar36 + -1, bVar37) {
    uVar1 = *(ulong *)src;
    auVar3._8_6_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xe] = (char)(uVar1 >> 0x38);
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[0xc] = (char)(uVar1 >> 0x30);
    auVar5._13_2_ = auVar3._13_2_;
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7._12_3_ = auVar5._12_3_;
    auVar9._8_2_ = 0;
    auVar9._0_8_ = uVar1;
    auVar9[10] = (char)(uVar1 >> 0x28);
    auVar9._11_4_ = auVar7._11_4_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11._10_5_ = auVar9._10_5_;
    auVar13[8] = (char)(uVar1 >> 0x20);
    auVar13._0_8_ = uVar1;
    auVar13._9_6_ = auVar11._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar13._8_7_;
    Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar31._9_6_ = 0;
    auVar31._0_9_ = Var26;
    auVar27._1_10_ = SUB1510(auVar31 << 0x30,5);
    auVar27[0] = (char)(uVar1 >> 0x10);
    auVar32._11_4_ = 0;
    auVar32._0_11_ = auVar27;
    auVar15[2] = (char)(uVar1 >> 8);
    auVar15._0_2_ = (ushort)uVar1;
    auVar15._3_12_ = SUB1512(auVar32 << 0x20,3);
    uVar2 = *(ulong *)ref;
    auVar4._8_6_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4[0xe] = (char)(uVar2 >> 0x38);
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar2;
    auVar6[0xc] = (char)(uVar2 >> 0x30);
    auVar6._13_2_ = auVar4._13_2_;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar2;
    auVar8._12_3_ = auVar6._12_3_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar2;
    auVar10[10] = (char)(uVar2 >> 0x28);
    auVar10._11_4_ = auVar8._11_4_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar2;
    auVar12._10_5_ = auVar10._10_5_;
    auVar14[8] = (char)(uVar2 >> 0x20);
    auVar14._0_8_ = uVar2;
    auVar14._9_6_ = auVar12._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar14._8_7_;
    Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar33._9_6_ = 0;
    auVar33._0_9_ = Var29;
    auVar30._1_10_ = SUB1510(auVar33 << 0x30,5);
    auVar30[0] = (char)(uVar2 >> 0x10);
    auVar34._11_4_ = 0;
    auVar34._0_11_ = auVar30;
    auVar16[2] = (char)(uVar2 >> 8);
    auVar16._0_2_ = (ushort)uVar2;
    auVar16._3_12_ = SUB1512(auVar34 << 0x20,3);
    auVar38._0_2_ = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
    auVar38._2_2_ = auVar15._2_2_ - auVar16._2_2_;
    auVar38._4_2_ = auVar27._0_2_ - auVar30._0_2_;
    auVar38._6_2_ = (short)Var26 - (short)Var29;
    auVar38._8_2_ = auVar13._8_2_ - auVar14._8_2_;
    auVar38._10_2_ = auVar9._10_2_ - auVar10._10_2_;
    auVar38._12_2_ = auVar5._12_2_ - auVar6._12_2_;
    auVar38._14_2_ = (auVar3._13_2_ >> 8) - (auVar4._13_2_ >> 8);
    auVar39 = pmaddwd(auVar38,auVar38);
    iVar17 = *(int *)((long)*sse + 4);
    lVar35 = (*sse)[1];
    iVar18 = *(int *)((long)*sse + 0xc);
    *(int *)*sse = auVar39._0_4_ + (int)(*sse)[0];
    *(int *)((long)*sse + 4) = auVar39._4_4_ + iVar17;
    *(int *)(*sse + 1) = auVar39._8_4_ + (int)lVar35;
    *(int *)((long)*sse + 0xc) = auVar39._12_4_ + iVar18;
    sVar19 = *(short *)((long)*sum + 2);
    sVar20 = *(short *)((long)*sum + 4);
    sVar21 = *(short *)((long)*sum + 6);
    lVar35 = (*sum)[1];
    sVar22 = *(short *)((long)*sum + 10);
    sVar23 = *(short *)((long)*sum + 0xc);
    sVar24 = *(short *)((long)*sum + 0xe);
    *(short *)*sum = auVar38._0_2_ + (short)(*sum)[0];
    *(short *)((long)*sum + 2) = auVar38._2_2_ + sVar19;
    *(short *)((long)*sum + 4) = auVar38._4_2_ + sVar20;
    *(short *)((long)*sum + 6) = auVar38._6_2_ + sVar21;
    *(short *)(*sum + 1) = auVar38._8_2_ + (short)lVar35;
    *(short *)((long)*sum + 10) = auVar38._10_2_ + sVar22;
    *(short *)((long)*sum + 0xc) = auVar38._12_2_ + sVar23;
    *(short *)((long)*sum + 0xe) = auVar38._14_2_ + sVar24;
    src = (uint8_t *)((long)src + (long)src_stride);
    ref = (uint8_t *)((long)ref + (long)ref_stride);
  }
  return;
}

Assistant:

static inline void variance8_sse2(const uint8_t *src, const int src_stride,
                                  const uint8_t *ref, const int ref_stride,
                                  const int h, __m128i *const sse,
                                  __m128i *const sum) {
  assert(h <= 128);  // May overflow for larger height.
  *sum = _mm_setzero_si128();
  *sse = _mm_setzero_si128();
  for (int i = 0; i < h; i++) {
    const __m128i s = load8_8to16_sse2(src);
    const __m128i r = load8_8to16_sse2(ref);

    variance_kernel_sse2(s, r, sse, sum);
    src += src_stride;
    ref += ref_stride;
  }
}